

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void rsqrtps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  _Bool _Var2;
  undefined8 uVar3;
  
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      if ((pMyDisasm->Reserved_).PrefRepe == 1) {
        (pMyDisasm->Prefix).RepPrefix = '\b';
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Instruction).Category = 0x40002;
        uVar3 = 0x73737472717372;
      }
      else {
        _Var2 = prefixes_present(pMyDisasm);
        if (_Var2) goto LAB_00119f2d;
        (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        (pMyDisasm->Instruction).Category = 0x40002;
        uVar3 = 0x73707472717372;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      return;
    }
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x02') {
      (pMyDisasm->Instruction).Category = 0x110000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrsqrtss",9);
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      (pMyDisasm->Reserved_).Register_ = 4;
      GyEy(pMyDisasm);
      return;
    }
    if (UVar1 == '\0') {
      (pMyDisasm->Instruction).Category = 0x110000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrsqrtps",9);
      vex_GxEx(pMyDisasm);
      return;
    }
  }
LAB_00119f2d:
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ rsqrtps_(PDISASM pMyDisasm)
{
 if (GV.EVEX.state == InUsePrefix) {
   failDecode(pMyDisasm);
 }
 else if (GV.VEX.state == InUsePrefix) {

   if (GV.VEX.pp == 0) {
     pMyDisasm->Instruction.Category = AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrtps");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     pMyDisasm->Instruction.Category = AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrtss");
     #endif
     GV.MemDecoration = Arg3dword;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);

   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
     GV.MemDecoration = Arg2dword;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rsqrtss");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rsqrtps");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
 }

}